

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O1

void __thiscall AActor::Thrust(AActor *this)

{
  double dVar1;
  double dVar2;
  
  dVar1 = this->Speed;
  dVar2 = FFastTrig::cos(&fasttrig,
                         (this->Angles).Yaw.Degrees * 11930464.711111112 + 6755399441055744.0);
  (this->Vel).X = dVar2 * dVar1 + (this->Vel).X;
  dVar1 = this->Speed;
  dVar2 = FFastTrig::sin(&fasttrig,
                         (this->Angles).Yaw.Degrees * 11930464.711111112 + 6755399441055744.0);
  (this->Vel).Y = dVar2 * dVar1 + (this->Vel).Y;
  return;
}

Assistant:

void Thrust()
	{
		Vel.X += Speed * Angles.Yaw.Cos();
		Vel.Y += Speed * Angles.Yaw.Sin();
	}